

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_SetShapeBlendMode(GPU_BlendPresetEnum preset)

{
  GPU_BlendMode local_28;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    GPU_GetBlendModeFromPreset(&local_28,preset);
    GPU_SetShapeBlendFunction
              (local_28.source_color,local_28.dest_color,local_28.source_alpha,local_28.dest_alpha);
    GPU_SetShapeBlendEquation(local_28.color_equation,local_28.alpha_equation);
    return;
  }
  return;
}

Assistant:

void GPU_SetShapeBlendMode(GPU_BlendPresetEnum preset)
{
    GPU_BlendMode b;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return;

    b = GPU_GetBlendModeFromPreset(preset);
    GPU_SetShapeBlendFunction(b.source_color, b.dest_color, b.source_alpha, b.dest_alpha);
    GPU_SetShapeBlendEquation(b.color_equation, b.alpha_equation);
}